

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O3

void __thiscall
Saturation::ConsequenceFinder::onNewPropositionalClause(ConsequenceFinder *this,Clause *cl)

{
  Literal *pLVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint uVar4;
  Clause *pCVar5;
  ostream *poVar6;
  bool *pbVar7;
  uint *puVar8;
  long lVar9;
  byte bVar10;
  Literal *pLVar11;
  Literal *pLVar12;
  ulong n;
  bool bVar13;
  string local_50;
  
  pCVar5 = Inferences::DuplicateLiteralRemovalISE::simplify(&this->_dlr,cl);
  if (pCVar5 != cl) {
    Kernel::Clause::destroyIfUnnecessary(pCVar5);
    return;
  }
  bVar3 = Kernel::Clause::noSplits(cl);
  if ((bVar3) &&
     (pCVar5 = Inferences::TautologyDeletionISE::simplify(&this->_td,cl), pCVar5 != (Clause *)0x0))
  {
    uVar4 = *(uint *)&cl->field_0x38 & 0xfffff;
    if (uVar4 == 0) {
      pLVar12 = (Literal *)0x0;
      bVar10 = 1;
    }
    else {
      bVar10 = 1;
      lVar9 = 0;
      pLVar12 = (Literal *)0x0;
      do {
        pLVar1 = cl->_literals[lVar9];
        if ((*(byte *)(*(long *)(*(long *)(DAT_00b521b0 + 0x80) +
                                (ulong)(pLVar1->super_Term)._functor * 8) + 0x40) & 0x20) == 0) {
          return;
        }
        bVar3 = pLVar12 == (Literal *)0x0;
        pLVar11 = pLVar12;
        if (bVar3) {
          pLVar11 = pLVar1;
        }
        bVar13 = ((pLVar1->super_Term)._args[0]._content & 4) == 0;
        if (!bVar13) {
          pLVar12 = pLVar11;
        }
        bVar10 = bVar10 & (bVar13 || bVar3);
        lVar9 = lVar9 + 1;
      } while ((uint)lVar9 < uVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Pure cf clause: ",0x10);
    Kernel::Clause::toNiceString_abi_cxx11_(&local_50,cl);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((bool)(bVar10 & pLVar12 != (Literal *)0x0)) {
      uVar4 = (pLVar12->super_Term)._functor;
      n = (ulong)uVar4;
      if ((this->_redundant).super_Array<bool>._capacity <= n) {
        Lib::Array<bool>::expandToFit(&(this->_redundant).super_Array<bool>,n);
      }
      pbVar7 = (this->_redundant).super_Array<bool>._array;
      if (pbVar7[n] == false) {
        if ((this->_redundant).super_Array<bool>._capacity <= n) {
          Lib::Array<bool>::expandToFit(&(this->_redundant).super_Array<bool>,n);
          pbVar7 = (this->_redundant).super_Array<bool>._array;
        }
        pbVar7[n] = true;
        puVar8 = (this->_redundantsToHandle)._cursor;
        if (puVar8 == (this->_redundantsToHandle)._end) {
          Lib::Stack<unsigned_int>::expand(&this->_redundantsToHandle);
          puVar8 = (this->_redundantsToHandle)._cursor;
        }
        *puVar8 = uVar4;
        (this->_redundantsToHandle)._cursor = puVar8 + 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Consequence found: ",0x13);
        puVar2 = *(undefined8 **)(*(long *)(DAT_00b521b0 + 0x80) + (long)(int)uVar4 * 8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)*puVar2,puVar2[1]);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
  }
  return;
}

Assistant:

void ConsequenceFinder::onNewPropositionalClause(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  //remove duplicate literals (necessary for tautology deletion)
  Clause* dlrCl=_dlr.simplify(cl);

  bool dlrSimplified=dlrCl!=cl;
  if(dlrSimplified) {
    //the function will be called again with the clause that is already simplified
    //TODO: get some cheaper way of testing for duplicate literals presence
    dlrCl->destroyIfUnnecessary();
    return;
  }


  if(!cl->noSplits() || !_td.simplify(cl)) {
    return;
  }
  Literal* pos=0;
  bool horn=true;
  for (auto l : cl->iterLits()) {
    if(!env.signature->getPredicate(l->functor())->label()) {
      return;
    }
    if(l->isPositive()) {
      if(pos) {
        horn=false;
      }
      else {
        pos=l;
      }
    }
  }

  std::cout << "Pure cf clause: " << cl->toNiceString() <<endl;

  if(!horn || !pos) {
    return;
  }

  unsigned red=pos->functor(); //redundant cf symbol number
  if(_redundant[red]) {
    return;
  }
  _redundant[red]=true;

  //we will remove the redundant clauses later -- now we may be at some unsuitable part
  //of the saturation algorithm loop
  _redundantsToHandle.push(red);

  std::cout << "Consequence found: " << env.signature->predicateName(red) << endl;
}